

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reoCore.c
# Opt level: O1

void reoReorderArray(reo_man *p,DdManager *dd,DdNode **Funcs,DdNode **FuncsRes,int nFuncs,
                    int *pOrder)

{
  double dVar1;
  double dVar2;
  int *piVar3;
  int iVar4;
  int *piVar5;
  reo_unit *prVar6;
  DdNode *pDVar7;
  long lVar8;
  int *piVar9;
  long lVar10;
  int iVar11;
  int *piVar12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  
  p->dd = dd;
  p->pOrder = pOrder;
  p->nTops = nFuncs;
  iVar4 = Cudd_SharingSize(Funcs,nFuncs);
  p->nNodesBeg = iVar4;
  iVar11 = dd->size;
  if (dd->size < dd->sizeZ) {
    iVar11 = dd->sizeZ;
  }
  reoResizeStructures(p,iVar11,iVar4,nFuncs);
  piVar5 = Extra_VectorSupportArray(dd,Funcs,nFuncs,p->pSupp);
  p->pSupp = piVar5;
  p->nSupp = 0;
  iVar11 = dd->size;
  if (0 < (long)iVar11) {
    iVar4 = p->nSupp;
    lVar8 = 0;
    do {
      iVar4 = iVar4 + piVar5[lVar8];
      p->nSupp = iVar4;
      lVar8 = lVar8 + 1;
    } while (iVar11 != lVar8);
  }
  if (p->nSupp == 0) {
    if (nFuncs < 1) {
      return;
    }
    uVar13 = 0;
    do {
      pDVar7 = Funcs[uVar13];
      FuncsRes[uVar13] = pDVar7;
      Cudd_Ref(pDVar7);
      uVar13 = uVar13 + 1;
    } while ((uint)nFuncs != uVar13);
    return;
  }
  if (0 < dd->size) {
    piVar3 = dd->invperm;
    lVar8 = 0;
    iVar11 = 0;
    piVar9 = piVar3;
    do {
      if (piVar5[*piVar9] != 0) {
        p->pMapToPlanes[*piVar9] = iVar11;
        p->pMapToDdVarsOrig[iVar11] = *piVar9;
        piVar12 = piVar3 + iVar11;
        if (p->fRemapUp == 0) {
          piVar12 = piVar9;
        }
        p->pMapToDdVarsFinal[iVar11] = *piVar12;
        p->pOrderInt[iVar11] = iVar11;
        iVar11 = iVar11 + 1;
      }
      lVar8 = lVar8 + 1;
      piVar9 = piVar9 + 1;
    } while (lVar8 < dd->size);
  }
  p->nUnitsUsed = 0;
  p->nNodesCur = 0;
  p->fThisIsAdd = 0;
  p->Signature = p->Signature + 1;
  uVar13 = (ulong)(uint)nFuncs;
  if (0 < nFuncs) {
    uVar14 = 0;
    do {
      prVar6 = reoTransferNodesToUnits_rec(p,Funcs[uVar14]);
      p->pTops[uVar14] = prVar6;
      uVar14 = uVar14 + 1;
    } while (uVar13 != uVar14);
  }
  if (p->nNodesBeg != p->nNodesCur) {
    __assert_fail("p->nNodesBeg == p->nNodesCur",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/reo/reoCore.c"
                  ,0x67,
                  "void reoReorderArray(reo_man *, DdManager *, DdNode **, DdNode **, int, int *)");
  }
  if ((p->fThisIsAdd == 0) && (p->fMinWidth != 0)) {
    puts("An important message from the REO reordering engine:");
    puts("The BDD given to the engine for reordering contains complemented edges.");
    puts("Currently, such BDDs cannot be reordered for the minimum width.");
    puts("Therefore, minimization for the number of BDD nodes is performed.");
    fflush(_stdout);
    p->fMinWidth = 0;
    p->fMinApl = 0;
  }
  if (p->fMinWidth == 0) {
    if (p->fMinApl == 0) {
      reoProfileNodesStart(p);
    }
    else {
      reoProfileAplStart(p);
    }
  }
  else {
    reoProfileWidthStart(p);
  }
  if (p->fVerbose != 0) {
    puts("INITIAL:");
    if (p->fMinWidth == 0) {
      if (p->fMinApl == 0) {
        reoProfileNodesPrint(p);
      }
      else {
        reoProfileAplPrint(p);
      }
    }
    else {
      reoProfileWidthPrint(p);
    }
  }
  p->nSwaps = 0;
  p->nNISwaps = 0;
  if (0 < p->nIters) {
    iVar11 = 0;
    do {
      reoReorderSift(p);
      if (p->fVerbose != 0) {
        printf("ITER #%d:\n");
        if (p->fMinWidth == 0) {
          if (p->fMinApl == 0) {
            reoProfileNodesPrint(p);
          }
          else {
            reoProfileAplPrint(p);
          }
        }
        else {
          reoProfileWidthPrint(p);
        }
      }
      if (p->fMinWidth == 0) {
        if (p->fMinApl == 0) {
          iVar4 = p->nNodesCur;
          p->nNodesEnd = iVar4;
          bVar15 = iVar4 == p->nNodesBeg;
          if (p->nNodesBeg < iVar4) {
            __assert_fail("p->nNodesEnd <= p->nNodesBeg",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/reo/reoCore.c"
                          ,0xaa,
                          "void reoReorderArray(reo_man *, DdManager *, DdNode **, DdNode **, int, int *)"
                         );
          }
          goto LAB_00812078;
        }
        dVar1 = p->nAplCur;
        dVar2 = p->nAplBeg;
        p->nAplEnd = dVar1;
        if (dVar2 < dVar1) {
          __assert_fail("p->nAplEnd <= p->nAplBeg",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/reo/reoCore.c"
                        ,0xa3,
                        "void reoReorderArray(reo_man *, DdManager *, DdNode **, DdNode **, int, int *)"
                       );
        }
        if ((dVar1 == dVar2) && (!NAN(dVar1) && !NAN(dVar2))) break;
      }
      else {
        iVar4 = p->nWidthCur;
        p->nWidthEnd = iVar4;
        bVar15 = iVar4 == p->nWidthBeg;
        if (!bVar15 && p->nWidthBeg <= iVar4) {
          __assert_fail("p->nWidthEnd <= p->nWidthBeg",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/reo/reoCore.c"
                        ,0x9c,
                        "void reoReorderArray(reo_man *, DdManager *, DdNode **, DdNode **, int, int *)"
                       );
        }
LAB_00812078:
        if (bVar15) break;
      }
      iVar11 = iVar11 + 1;
    } while (iVar11 < p->nIters);
  }
  if (0 < (long)p->nSupp) {
    uVar14 = 0;
    do {
      if (p->pPlanes[uVar14].statsNodes == 0) {
        __assert_fail("p->pPlanes[i].statsNodes",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/reo/reoCore.c"
                      ,0x1aa,"int reoCheckLevels(reo_man *)");
      }
      for (prVar6 = p->pPlanes[uVar14].pHead; prVar6 != (reo_unit *)0x0; prVar6 = prVar6->Next) {
        if (uVar14 != (uint)(int)prVar6->lev) {
          __assert_fail("pUnit->lev == i",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/reo/reoCore.c"
                        ,0x1ae,"int reoCheckLevels(reo_man *)");
        }
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != (long)p->nSupp);
  }
  s_AplBefore = p->nAplBeg;
  s_AplAfter = p->nAplEnd;
  p->nRefNodes = 0;
  p->nNodesCur = 0;
  p->Signature = p->Signature + 1;
  if (0 < nFuncs) {
    uVar14 = 0;
    do {
      pDVar7 = reoTransferUnitsToNodes_rec(p,p->pTops[uVar14]);
      FuncsRes[uVar14] = pDVar7;
      Cudd_Ref(pDVar7);
      uVar14 = uVar14 + 1;
    } while (uVar13 != uVar14);
  }
  if (0 < p->nRefNodes) {
    lVar8 = 0;
    do {
      Cudd_RecursiveDeref(dd,p->pRefNodes[lVar8]);
      lVar8 = lVar8 + 1;
    } while (lVar8 < p->nRefNodes);
  }
  if (0 < nFuncs) {
    uVar14 = 0;
    do {
      reoRecursiveDeref(p->pTops[uVar14]);
      uVar14 = uVar14 + 1;
    } while (uVar13 != uVar14);
  }
  for (prVar6 = p->pPlanes[p->nSupp].pHead; prVar6 != (reo_unit *)0x0; prVar6 = prVar6->Next) {
    if (prVar6->n != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/reo/reoCore.c"
                    ,0x191,"int reoCheckZeroRefs(reo_plane *)");
    }
  }
  piVar5 = p->pOrder;
  if ((piVar5 != (int *)0x0) && (0 < p->nSupp)) {
    piVar3 = p->pOrderInt;
    piVar9 = p->pMapToDdVarsOrig;
    piVar12 = p->pMapToDdVarsFinal;
    lVar8 = 0;
    do {
      piVar5[piVar12[lVar8]] = piVar9[piVar3[lVar8]];
      lVar8 = lVar8 + 1;
    } while (lVar8 < p->nSupp);
  }
  if (p->fVerify == 0) goto LAB_0081234f;
  if (piVar5 == (int *)0x0) {
    lVar8 = (long)p->nSupp;
    piVar5 = (int *)malloc(lVar8 * 4);
    if (0 < lVar8) {
      piVar3 = p->pOrderInt;
      piVar9 = p->pMapToDdVarsOrig;
      piVar12 = p->pMapToDdVarsFinal;
      lVar10 = 0;
      do {
        piVar5[piVar12[lVar10]] = piVar9[piVar3[lVar10]];
        lVar10 = lVar10 + 1;
      } while (lVar8 != lVar10);
    }
  }
  if (nFuncs < 1) {
LAB_0081232f:
    puts("REO: Internal verification is okay!");
  }
  else {
    bVar15 = true;
    uVar14 = 0;
    do {
      if (p->fThisIsAdd == 0) {
        pDVar7 = Cudd_bddPermute(dd,FuncsRes[uVar14],piVar5);
      }
      else {
        pDVar7 = Cudd_addPermute(dd,FuncsRes[uVar14],piVar5);
      }
      Cudd_Ref(pDVar7);
      if (pDVar7 != Funcs[uVar14]) {
        puts("REO: Internal verification has failed!");
        fflush(_stdout);
        bVar15 = false;
      }
      Cudd_RecursiveDeref(dd,pDVar7);
      uVar14 = uVar14 + 1;
    } while (uVar13 != uVar14);
    if (bVar15) goto LAB_0081232f;
  }
  if ((piVar5 != (int *)0x0) && (p->pOrder == (int *)0x0)) {
    free(piVar5);
  }
LAB_0081234f:
  if (-1 < p->nSupp) {
    lVar8 = -1;
    lVar10 = 0;
    do {
      reoUnitsRecycleUnitList(p,(reo_plane *)((long)&p->pPlanes->fSifted + lVar10));
      lVar8 = lVar8 + 1;
      lVar10 = lVar10 + 0x38;
    } while (lVar8 < p->nSupp);
  }
  return;
}

Assistant:

void reoReorderArray( reo_man * p, DdManager * dd, DdNode * Funcs[], DdNode * FuncsRes[], int nFuncs, int * pOrder )
{
    int Counter, i;

    // set the initial parameters
    p->dd     = dd;
    p->pOrder = pOrder;
    p->nTops  = nFuncs;
    // get the initial number of nodes
    p->nNodesBeg = Cudd_SharingSize( Funcs, nFuncs );     
    // resize the internal data structures of the manager if necessary
    reoResizeStructures( p, ddMax(dd->size,dd->sizeZ), p->nNodesBeg, nFuncs );
    // compute the support
    p->pSupp = Extra_VectorSupportArray( dd, Funcs, nFuncs, p->pSupp );
    // get the number of support variables
    p->nSupp = 0;
    for ( i = 0; i < dd->size; i++ )
        p->nSupp += p->pSupp[i];

    // if it is the constant function, no need to reorder
    if ( p->nSupp == 0 )
    {
        for ( i = 0; i < nFuncs; i++ )
        {
            FuncsRes[i] = Funcs[i]; Cudd_Ref( FuncsRes[i] );
        }
        return;
    }

    // create the internal variable maps
    // go through variable levels in the manager
    Counter = 0;
    for ( i = 0; i < dd->size; i++ )
        if ( p->pSupp[ dd->invperm[i] ] )
        {
            p->pMapToPlanes[ dd->invperm[i] ] = Counter;
            p->pMapToDdVarsOrig[Counter]      = dd->invperm[i];
            if ( !p->fRemapUp )
                p->pMapToDdVarsFinal[Counter] = dd->invperm[i];
            else
                p->pMapToDdVarsFinal[Counter] = dd->invperm[Counter];
            p->pOrderInt[Counter]        = Counter;
            Counter++;
        }

    // set the initial parameters
    p->nUnitsUsed = 0;
    p->nNodesCur  = 0;
    p->fThisIsAdd = 0;
    p->Signature++;
    // transfer the function from the CUDD package into REO"s internal data structure
    for ( i = 0; i < nFuncs; i++ )
        p->pTops[i] = reoTransferNodesToUnits_rec( p, Funcs[i] );
    assert( p->nNodesBeg == p->nNodesCur );

    if ( !p->fThisIsAdd && p->fMinWidth )
    {
        printf( "An important message from the REO reordering engine:\n" );
        printf( "The BDD given to the engine for reordering contains complemented edges.\n" );
        printf( "Currently, such BDDs cannot be reordered for the minimum width.\n" );
        printf( "Therefore, minimization for the number of BDD nodes is performed.\n" );
        fflush( stdout );
        p->fMinApl   = 0;
        p->fMinWidth = 0;
    }

    if ( p->fMinWidth )
        reoProfileWidthStart(p);
    else if ( p->fMinApl )
        reoProfileAplStart(p);
    else 
        reoProfileNodesStart(p);

    if ( p->fVerbose )
    {
        printf( "INITIAL:\n" );
        if ( p->fMinWidth )
            reoProfileWidthPrint(p);
        else if ( p->fMinApl )
            reoProfileAplPrint(p);
        else
            reoProfileNodesPrint(p);
    }
 
    ///////////////////////////////////////////////////////////////////
    // performs the reordering
    p->nSwaps   = 0;
    p->nNISwaps = 0;
    for ( i = 0; i < p->nIters; i++ )
    {
        reoReorderSift( p );
        // print statistics after each iteration
        if ( p->fVerbose )
        {
            printf( "ITER #%d:\n", i+1 );
            if ( p->fMinWidth )
                reoProfileWidthPrint(p);
            else if ( p->fMinApl )
                reoProfileAplPrint(p);
            else
                reoProfileNodesPrint(p);
        }
        // if the cost function did not change, stop iterating
        if ( p->fMinWidth )
        {
            p->nWidthEnd = p->nWidthCur;
            assert( p->nWidthEnd <= p->nWidthBeg );
            if ( p->nWidthEnd == p->nWidthBeg )
                break;
        }
        else if ( p->fMinApl )
        {
            p->nAplEnd = p->nAplCur;
            assert( p->nAplEnd <= p->nAplBeg );
            if ( p->nAplEnd == p->nAplBeg )
                break;
        }
        else
        {
            p->nNodesEnd = p->nNodesCur;
            assert( p->nNodesEnd <= p->nNodesBeg );
            if ( p->nNodesEnd == p->nNodesBeg )
                break;
        }
    }
    assert( reoCheckLevels( p ) );
    ///////////////////////////////////////////////////////////////////

s_AplBefore = p->nAplBeg;
s_AplAfter  = p->nAplEnd;

    // set the initial parameters
    p->nRefNodes  = 0;
    p->nNodesCur  = 0;
    p->Signature++;
    // transfer the BDDs from REO's internal data structure to CUDD
    for ( i = 0; i < nFuncs; i++ )
    {
        FuncsRes[i] = reoTransferUnitsToNodes_rec( p, p->pTops[i] ); Cudd_Ref( FuncsRes[i] );
    }
    // undo the DDs referenced for storing in the cache
    for ( i = 0; i < p->nRefNodes; i++ )
        Cudd_RecursiveDeref( dd, p->pRefNodes[i] );
    // verify zero refs of the terminal nodes
    for ( i = 0; i < nFuncs; i++ )
    {
        assert( reoRecursiveDeref( p->pTops[i] ) );
    }
    assert( reoCheckZeroRefs( &(p->pPlanes[p->nSupp]) ) );

    // prepare the variable map to return to the user
    if ( p->pOrder )
    {
        // i is the current level in the planes data structure
        // p->pOrderInt[i] is the original level in the planes data structure
        // p->pMapToDdVarsOrig[i] is the variable, into which we remap when we construct the BDD from planes
        // p->pMapToDdVarsOrig[ p->pOrderInt[i] ] is the original BDD variable corresponding to this level
        // Therefore, p->pOrder[ p->pMapToDdVarsFinal[i] ] = p->pMapToDdVarsOrig[ p->pOrderInt[i] ]
        // creates the permutation, which remaps the resulting BDD variable into the original BDD variable
        for ( i = 0; i < p->nSupp; i++ )
            p->pOrder[ p->pMapToDdVarsFinal[i] ] = p->pMapToDdVarsOrig[ p->pOrderInt[i] ]; 
    }

    if ( p->fVerify )
    {
        int fVerification;
        DdNode * FuncRemapped;
        int * pOrder;

        if ( p->pOrder == NULL )
        {
            pOrder = ABC_ALLOC( int, p->nSupp );
            for ( i = 0; i < p->nSupp; i++ )
                pOrder[ p->pMapToDdVarsFinal[i] ] = p->pMapToDdVarsOrig[ p->pOrderInt[i] ]; 
        }
        else
            pOrder = p->pOrder;

        fVerification = 1;
        for ( i = 0; i < nFuncs; i++ )
        {
            // verify the result
            if ( p->fThisIsAdd )
                FuncRemapped = Cudd_addPermute( dd, FuncsRes[i], pOrder );
            else
                FuncRemapped = Cudd_bddPermute( dd, FuncsRes[i], pOrder );
            Cudd_Ref( FuncRemapped );

            if ( FuncRemapped != Funcs[i] )
            {
                fVerification = 0;
                printf( "REO: Internal verification has failed!\n" );
                fflush( stdout );
            }
            Cudd_RecursiveDeref( dd, FuncRemapped );
        }
        if ( fVerification )
            printf( "REO: Internal verification is okay!\n" );

        if ( p->pOrder == NULL )
            ABC_FREE( pOrder );
    }

    // recycle the data structure
    for ( i = 0; i <= p->nSupp; i++ )
        reoUnitsRecycleUnitList( p, p->pPlanes + i );
}